

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockMatcher.cpp
# Opt level: O0

void __thiscall StockMatcher::populateCacheStream(StockMatcher *this)

{
  byte bVar1;
  long lVar2;
  undefined1 local_30 [8];
  string textLine;
  StockMatcher *this_local;
  
  textLine.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&this->m_inputFileStream,(string *)local_30);
    lVar2 = std::__cxx11::string::length();
    if (lVar2 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_cachedStream,(value_type *)local_30);
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void StockMatcher::populateCacheStream()
{
	// This function tries to populate the cache stream from messages of the file and close the file handle. 
	// This is to avoid accessing ifstream in threaded mode since it is not safe and does not seem to work
	// With even locks.

	std::string textLine;
	while(!m_inputFileStream.eof())
	{
		getline(m_inputFileStream, textLine);
		if(textLine.length() > 0)
		{
			m_cachedStream.push_back(textLine);
		}
	}

	m_inputFileStream.close();
}